

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlFeatureSetting::DebugXmlFeatures(GdlFeatureSetting *this,ofstream *strmOut,string *staPathToCur)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  GrpLineAndFile lnf;
  string local_90;
  string local_70;
  GrpLineAndFile local_50;
  
  GrpLineAndFile::GrpLineAndFile(&local_50,(GrpLineAndFile *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)strmOut,"      <featureSetting name=\"",0x1c);
  paVar1 = &local_90.field_2;
  pcVar2 = (this->m_staName)._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->m_staName)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)strmOut,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" value=\"",9);
  std::ostream::operator<<(poVar3,this->m_nValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_50.m_nLinePre != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" inFile=\"",10);
    pcVar2 = (staPathToCur->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + staPathToCur->_M_string_length);
    GrpLineAndFile::FileWithPath(&local_90,&local_50,&local_70);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)strmOut,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" atLine=\"",10);
    std::ostream::operator<<(poVar3,local_50.m_nLineOrig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" />\n",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_staFile._M_dataplus._M_p != &local_50.m_staFile.field_2) {
    operator_delete(local_50.m_staFile._M_dataplus._M_p,
                    local_50.m_staFile.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GdlFeatureSetting::DebugXmlFeatures(std::ofstream & strmOut, std::string staPathToCur)
{
	GrpLineAndFile lnf = this->LineAndFile();
	strmOut << "      <featureSetting name=\"" << this->Name()
		<< "\" value=\"" << this->Value();

	if (!lnf.NotSet())
		strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
			<< "\" atLine=\"" << lnf.OriginalLine();

	strmOut << "\" />\n";
}